

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

float r4_uniform_01(int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar3 = *seed;
  if (iVar3 != 0) {
    iVar1 = (iVar3 % 0x1f31d) * 0x41a7;
    iVar3 = (iVar3 / 0x1f31d) * -0xb14;
    iVar2 = iVar1 + iVar3;
    iVar3 = iVar1 + iVar3 + 0x7fffffff;
    if (-1 < iVar2) {
      iVar3 = iVar2;
    }
    *seed = iVar3;
    return (float)iVar3 * 4.656613e-10;
  }
  std::operator<<((ostream *)&std::cerr,"\n");
  std::operator<<((ostream *)&std::cerr,"R4_UNIFORM_01 - Fatal error!\n");
  std::operator<<((ostream *)&std::cerr,"  Input value of SEED = 0.\n");
  exit(1);
}

Assistant:

float r4_uniform_01 ( int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    R4_UNIFORM_01 returns a unit pseudorandom R4.
//
//  Discussion:
//
//    This routine implements the recursion
//
//      seed = 16807 * seed mod ( 2^31 - 1 )
//      r4_uniform_01 = seed / ( 2^31 - 1 )
//
//    The integer arithmetic never requires more than 32 bits,
//    including a sign bit.
//
//    If the initial seed is 12345, then the first three computations are
//
//      Input     Output      R4_UNIFORM_01
//      SEED      SEED
//
//         12345   207482415  0.096616
//     207482415  1790989824  0.833995
//    1790989824  2035175616  0.947702
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 November 2004
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Paul Bratley, Bennett Fox, Linus Schrage,
//    A Guide to Simulation,
//    Springer Verlag, pages 201-202, 1983.
//
//    Pierre L'Ecuyer,
//    Random Number Generation,
//    in Handbook of Simulation
//    edited by Jerry Banks,
//    Wiley Interscience, page 95, 1998.
//
//    Bennett Fox,
//    Algorithm 647:
//    Implementation and Relative Efficiency of Quasirandom
//    Sequence Generators,
//    ACM Transactions on Mathematical Software,
//    Volume 12, Number 4, pages 362-376, 1986.
//
//    Peter Lewis, Allen Goodman, James Miller,
//    A Pseudo-Random Number Generator for the System/360,
//    IBM Systems Journal,
//    Volume 8, pages 136-143, 1969.
//
//  Parameters:
//
//    Input/output, int &SEED, the "seed" value.  Normally, this
//    value should not be 0.  On output, SEED has been updated.
//
//    Output, float R4_UNIFORM_01, a new pseudorandom variate, strictly between
//    0 and 1.
//
{
  int k;
  float value;

  if ( seed == 0 )
  {
    cerr << "\n";
    cerr << "R4_UNIFORM_01 - Fatal error!\n";
    cerr << "  Input value of SEED = 0.\n";
    exit ( 1 );
  }

  k = seed / 127773;

  seed = 16807 * ( seed - k * 127773 ) - k * 2836;

  if ( seed < 0 )
  {
    seed = seed + 2147483647;
  }
//
//  Although SEED can be represented exactly as a 32 bit integer,
//  it generally cannot be represented exactly as a 32 bit real number.
//
  value = static_cast<float>(seed) * 4.656612875E-10;

  return value;
}